

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::parse(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
        *this,item_event_visitor *visitor,error_code *ec)

{
  pointer ppVar1;
  pointer ppVar2;
  uchar *puVar3;
  assertion_error *this_00;
  allocator<char> local_51;
  string local_50;
  
switchD_00228b60_default:
  if (this->done_ != false) {
    return;
  }
  if (this->more_ != true) {
    return;
  }
  ppVar1 = (this->state_stack_).
           super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  switch(ppVar1[-1].mode) {
  case root:
    ppVar1[-1].mode = accept;
    break;
  case accept:
    ppVar2 = (this->state_stack_).
             super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)ppVar1 - (long)ppVar2 != 0x20) {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"assertion \'state_stack_.size() == 1\' failed at  <> :0",
                 &local_51);
      assertion_error::assertion_error(this_00,&local_50);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (ppVar1 != ppVar2) {
      (this->state_stack_).
      super__Vector_base<jsoncons::cbor::parse_state,_std::allocator<jsoncons::cbor::parse_state>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppVar2;
    }
    this->more_ = false;
    this->done_ = true;
    (*visitor->_vptr_basic_item_event_visitor[2])(visitor);
    goto switchD_00228b60_default;
  case array:
    if (ppVar1[-1].length <= ppVar1[-1].index) {
LAB_00228bc7:
      end_array(this,visitor,ec);
      goto switchD_00228b60_default;
    }
    ppVar1[-1].index = ppVar1[-1].index + 1;
    break;
  case indefinite_array:
    puVar3 = (this->source_).current_._M_current;
    if (puVar3 == (this->source_).end_._M_current) {
LAB_00228c8e:
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      return;
    }
    if (*puVar3 == 0xff) {
      binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::ignore(&this->source_,1);
      goto LAB_00228bc7;
    }
    break;
  case map_key:
    if (ppVar1[-1].length <= ppVar1[-1].index) {
LAB_00228c7b:
      end_object(this,visitor,ec);
      goto switchD_00228b60_default;
    }
    ppVar1[-1].index = ppVar1[-1].index + 1;
    ppVar1[-1].mode = map_value;
    break;
  case map_value:
    ppVar1[-1].mode = map_key;
    break;
  case indefinite_map_key:
    puVar3 = (this->source_).current_._M_current;
    if (puVar3 == (this->source_).end_._M_current) goto LAB_00228c8e;
    if (*puVar3 == 0xff) {
      binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::ignore(&this->source_,1);
      goto LAB_00228c7b;
    }
    ppVar1[-1].mode = indefinite_map_value;
    break;
  case indefinite_map_value:
    ppVar1[-1].mode = indefinite_map_key;
    break;
  case multi_dim:
    if (ppVar1[-1].index != 0) {
      produce_end_multi_dim(this,visitor,ec);
      goto switchD_00228b60_default;
    }
    ppVar1[-1].index = 1;
    break;
  default:
    goto switchD_00228b60_default;
  }
  read_item(this,visitor,ec);
  goto switchD_00228b60_default;
}

Assistant:

void parse(item_event_visitor& visitor, std::error_code& ec)
    {
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::multi_dim:
                {
                    if (state_stack_.back().index == 0)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        produce_end_multi_dim(visitor, ec);
                    }
                    break;
                }
                case parse_mode::array:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_array(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_array:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_array(visitor, ec);
                    }
                    else
                    {
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_key:
                {
                    if (state_stack_.back().index < state_stack_.back().length)
                    {
                        ++state_stack_.back().index;
                        state_stack_.back().mode = parse_mode::map_value;
                        read_item(visitor, ec);
                    }
                    else
                    {
                        end_object(visitor, ec);
                    }
                    break;
                }
                case parse_mode::map_value:
                {
                    state_stack_.back().mode = parse_mode::map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::indefinite_map_key:
                {
                    auto c = source_.peek();
                    if (JSONCONS_UNLIKELY(c.eof))
                    {
                        ec = cbor_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (c.value == 0xff)
                    {
                        source_.ignore(1);
                        end_object(visitor, ec);
                    }
                    else
                    {
                        state_stack_.back().mode = parse_mode::indefinite_map_value;
                        read_item(visitor, ec);
                    }
                    break;
                }
                case parse_mode::indefinite_map_value:
                {
                    state_stack_.back().mode = parse_mode::indefinite_map_key;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::root:
                {
                    state_stack_.back().mode = parse_mode::accept;
                    read_item(visitor, ec);
                    break;
                }
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }